

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O1

bool __thiscall
optimization::global_expr_move::BlockOps::disable_op
          (BlockOps *this,
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          *op)

{
  variant_alternative_t<1UL,_variant<Op,_pair<pair<VarId,_Value>,_VarId>_>_> *pvVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> load;
  anon_class_8_1_a78179b7_conflict local_68;
  undefined **local_60;
  uint local_58;
  _Copy_ctor_base<false,_int,_mir::inst::VarId> local_48;
  
  if ((op->
      super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ).
      super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ._M_index != '\0') {
    pvVar1 = std::
             get<1ul,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                       (op);
    local_68.__lhs = &local_48;
    local_60 = &PTR_display_001ee058;
    local_58 = (pvVar1->first).first.id;
    local_48.super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
         (pvVar1->first).second.field_0x18;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
      ::_S_vtable._M_arr[(long)(char)(pvVar1->first).second.field_0x18 + 1]._M_data)
              (&local_68,(variant<int,_mir::inst::VarId> *)&(pvVar1->first).second.field_0x8);
    p_Var4 = &(this->stores)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var4->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar5]) {
      bVar5 = *(uint *)&p_Var3[1]._M_parent < local_58;
      if (!bVar5) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var4) &&
       (p_Var3 = p_Var2, local_58 < *(uint *)&p_Var2[1]._M_parent)) {
      p_Var3 = &p_Var4->_M_header;
    }
    return (_Rb_tree_header *)p_Var3 != p_Var4;
  }
  return false;
}

Assistant:

bool disable_op(std::variant<Op, LoadOp> op) {
    if (op.index() == 0) {
      return false;
    } else {
      auto load = std::get<LoadOp>(op);
      return stores.count(load.first.first);
    }
  }